

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

int __thiscall
UnifiedRegex::
SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
::Print(SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
        *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_0145949d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x39);
  }
  DebugWriter::Print(w,
                     L"SyncToLiteralAndContinueInstT<ScannerMixin_WithLinearCharMap> aka SyncToLinearLiteralAndContinue"
                    );
  DebugWriter::Print(w,L"(");
  ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>::Print
            (&this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>,w,
             litbuf,false);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_0145949d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::
    PrintBytes<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>>>
              (&this->super_Inst,w,&this->super_Inst,
               &this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>,
               L"ScannerMixin_WithLinearCharMap");
    DebugWriter::Unindent(w);
  }
  return 0x39;
}

Assistant:

int SyncToLiteralAndContinueInstT<ScannerMixin_WithLinearCharMap>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        // NOTE: this text is unique to this instantiation
        PRINT_RE_BYTECODE_BEGIN("SyncToLiteralAndContinueInstT<ScannerMixin_WithLinearCharMap> aka SyncToLinearLiteralAndContinue");
        PRINT_MIXIN(ScannerMixin_WithLinearCharMap); // NOTE: would work with template <typename ScannerT> ScannerT::Print
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(ScannerMixin_WithLinearCharMap); // NOTE: unique because macro expansion and _u(#InstType) happen before template is evaluated (so text would be ScannerT)
        PRINT_RE_BYTECODE_END();
    }